

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

size_t google::protobuf::internal::WireFormatLite::
       MessageSizeNoVirtual<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>
                 (BayesianProbitRegressor_FeatureWeight *value)

{
  size_t sVar1;
  BayesianProbitRegressor_FeatureWeight *value_local;
  
  sVar1 = CoreML::Specification::BayesianProbitRegressor_FeatureWeight::ByteSizeLong(value);
  sVar1 = LengthDelimitedSize(sVar1);
  return sVar1;
}

Assistant:

inline size_t WireFormatLite::MessageSizeNoVirtual(
    const MessageType_WorkAroundCppLookupDefect& value) {
  return LengthDelimitedSize(
      value.MessageType_WorkAroundCppLookupDefect::ByteSizeLong());
}